

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

int Sfm_DecPeformDec_rec
              (Sfm_Dec_t *p,word *pTruth,int *pSupp,int *pAssump,int nAssump,word (*Masks) [8],
              int fCofactor,int nSuppAdd)

{
  Vec_Int_t *p_00;
  int *piVar1;
  ulong *puVar2;
  Sfm_Par_t *pSVar3;
  int *piVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  lit *end;
  abctime aVar11;
  abctime aVar12;
  word *pwVar13;
  word *pwVar14;
  word wVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  word (*pawVar19) [8];
  Vec_Int_t *p_01;
  ulong uVar20;
  word (*pawVar21) [8];
  lit *end_00;
  int c;
  ulong uVar22;
  long lVar23;
  char *pcVar24;
  ulong local_208;
  int nSupp [2];
  word MasksNext [2] [8];
  word uTruth [2] [4];
  int Supp [2] [16];
  
  if (8 < nAssump) {
    __assert_fail("nAssump <= SFM_SUPP_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                  ,0x32f,
                  "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                 );
  }
  lVar16 = (long)p->pPars->nBTLimit;
  pwVar14 = p->pDivWords[nAssump];
  if (p->pPars->fVeryVerbose != 0) {
    printf("\nObject %d\n",(ulong)(uint)p->iTarget);
    printf("Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ",(double)p->AreaMffc * 0.001,
           (ulong)(uint)p->nDivs,(ulong)(uint)(p->vObjGates).nSize,(ulong)(uint)p->nMffc);
    printf("Pat0 = %d.  Pat1 = %d.    ",(ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
    putchar(10);
    if (nAssump != 0) {
      printf("Cofactor: ");
      uVar20 = 0;
      if (0 < nAssump) {
        uVar20 = (ulong)(uint)nAssump;
      }
      for (uVar22 = 0; uVar20 != uVar22; uVar22 = uVar22 + 1) {
        iVar6 = Abc_LitIsCompl(pAssump[uVar22]);
        pcVar24 = "!";
        if (iVar6 == 0) {
          pcVar24 = "";
        }
        uVar7 = Abc_Lit2Var(pAssump[uVar22]);
        printf(" %s%d",pcVar24,(ulong)uVar7);
      }
      putchar(10);
    }
  }
  piVar1 = pAssump + nAssump;
  end = pAssump + (long)nAssump + 1;
  pawVar19 = Masks;
  for (uVar20 = 0; uVar20 != 2; uVar20 = uVar20 + 1) {
    uVar22 = (ulong)(uint)p->nPatWords[uVar20];
    if (p->nPatWords[uVar20] < 1) {
      uVar22 = 0;
    }
    uVar18 = 0;
    do {
      if (uVar22 == uVar18) {
        p->nSatCalls = p->nSatCalls + 1;
        iVar10 = (int)uVar20;
        iVar6 = Abc_Var2Lit(p->iTarget,iVar10);
        *piVar1 = iVar6;
        aVar11 = Abc_Clock();
        iVar6 = sat_solver_solve(p->pSat,pAssump,end,lVar16,0,0,0);
        if (iVar6 != 1) {
          if (iVar6 == -1) {
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            aVar12 = Abc_Clock();
            p->timeSatUnsat = p->timeSatUnsat + (aVar12 - aVar11);
            pSVar3 = p->pPars;
            iVar6 = pSVar3->nVarMax;
            bVar5 = (char)iVar6 - 6U & 0x1f;
            uVar18 = 0;
            uVar22 = (ulong)(uint)(1 << bVar5);
            if (1 << bVar5 < 1) {
              uVar22 = uVar18;
            }
            if (iVar6 < 7) {
              uVar22 = 1;
            }
            for (; uVar22 != uVar18; uVar18 = uVar18 + 1) {
              pTruth[uVar18] = (long)-iVar10;
            }
            if (pSVar3->fVeryVerbose == 0) {
              return 0;
            }
            pcVar24 = "Found constant %d.\n";
            local_208._0_4_ = 0;
            goto LAB_00402b42;
          }
          if (iVar6 != 0) {
            __assert_fail("status == l_True",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x355,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          goto LAB_00402e49;
        }
        p->nSatCallsSat = p->nSatCallsSat + 1;
        aVar12 = Abc_Clock();
        p->timeSatSat = p->timeSatSat + (aVar12 - aVar11);
        if (p->nPats[uVar20] == 0x200) {
          p->nSatCallsOver = p->nSatCallsOver + 1;
        }
        else {
          for (iVar6 = 0; iVar6 < p->nDivs; iVar6 = iVar6 + 1) {
            iVar8 = sat_solver_var_value(p->pSat,iVar6);
            if (iVar8 != 0) {
              pwVar13 = Sfm_DecDivPats(p,iVar6,iVar10);
              pwVar13[p->nPats[uVar20] >> 6] =
                   pwVar13[p->nPats[uVar20] >> 6] | 1L << ((byte)p->nPats[uVar20] & 0x3f);
            }
          }
          iVar6 = p->nPats[uVar20];
          p->nPatWords[uVar20] = (iVar6 >> 6) + 1;
          p->nPats[uVar20] = iVar6 + 1;
          Masks[uVar20][iVar6 >> 6] = Masks[uVar20][iVar6 >> 6] | 1L << ((byte)iVar6 & 0x3f);
        }
        break;
      }
      pwVar13 = *pawVar19 + uVar18;
      uVar18 = uVar18 + 1;
    } while (*pwVar13 == 0);
    pawVar19 = pawVar19 + 1;
  }
  uVar7 = p->iUseThis;
  if (uVar7 == 0xffffffff) {
    p->vImpls[0].nSize = 0;
    p_00 = p->vImpls;
    p->vImpls[1].nSize = 0;
    for (iVar6 = 0; iVar6 < p->nDivs; iVar6 = iVar6 + 1) {
      MasksNext[0][0] = 0xffffffffffffffff;
      uVar7 = (uint)(iVar6 * 4) >> 6;
      for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
        c = (int)lVar23;
        pwVar13 = Sfm_DecDivPats(p,iVar6,c);
        pawVar19 = Masks + lVar23;
        iVar10 = p->nPatWords[lVar23];
        iVar8 = Abc_TtIntersect(pwVar13,*pawVar19,iVar10,1);
        uVar9 = Abc_TtIntersect(pwVar13,*pawVar19,iVar10,0);
        if ((iVar8 == 0) || (uVar9 == 0)) {
          iVar10 = Abc_Var2Lit(p->iTarget,c);
          *piVar1 = iVar10;
          iVar10 = Abc_Var2Lit(iVar6,uVar9);
          piVar1[1] = iVar10;
          aVar11 = Abc_Clock();
          uVar9 = c * 2 | iVar6 * 4 & 0x3cU | uVar9;
          if ((pwVar14[uVar7] >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
            p->nSatCalls = p->nSatCalls + 1;
            iVar10 = sat_solver_solve(p->pSat,pAssump,piVar1 + 2,lVar16,0,0,0);
            if (iVar10 != -1) {
              if (iVar10 == 1) {
                p->nSatCallsSat = p->nSatCallsSat + 1;
                aVar12 = Abc_Clock();
                p->timeSatSat = p->timeSatSat + (aVar12 - aVar11);
                if (p->nPats[lVar23] == 0x200) {
                  p->nSatCallsOver = p->nSatCallsOver + 1;
                }
                else {
                  for (iVar10 = 0; iVar10 < p->nDivs; iVar10 = iVar10 + 1) {
                    iVar8 = sat_solver_var_value(p->pSat,iVar10);
                    if (iVar8 != 0) {
                      pwVar13 = Sfm_DecDivPats(p,iVar10,c);
                      pwVar13[p->nPats[lVar23] >> 6] =
                           pwVar13[p->nPats[lVar23] >> 6] | 1L << ((byte)p->nPats[lVar23] & 0x3f);
                    }
                  }
                  iVar10 = p->nPats[lVar23];
                  p->nPatWords[lVar23] = (iVar10 >> 6) + 1;
                  p->nPats[lVar23] = iVar10 + 1;
                  (*pawVar19)[iVar10 >> 6] = (*pawVar19)[iVar10 >> 6] | 1L << ((byte)iVar10 & 0x3f);
                }
                goto LAB_00402d6b;
              }
              if (iVar10 != 0) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x393,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
              goto LAB_00402e49;
            }
            iVar10 = p->nSatCallsUnsat + 1;
          }
          else {
            iVar10 = p->nSatCallsUnsat;
          }
          p->nSatCallsUnsat = iVar10;
          aVar12 = Abc_Clock();
          p->timeSatUnsat = p->timeSatUnsat + (aVar12 - aVar11);
          iVar10 = Abc_LitNot(*end);
          *(int *)((long)MasksNext[0] + lVar23 * 4) = iVar10;
          iVar10 = Abc_LitNot(*end);
          Vec_IntPush(p_00 + lVar23,iVar10);
          puVar2 = pwVar14 + uVar7;
          *puVar2 = *puVar2 | 1L << ((byte)uVar9 & 0x3f);
        }
LAB_00402d6b:
      }
      iVar10 = (int)MasksNext[0][0];
      iVar8 = MasksNext[0][0]._4_4_;
      if (MasksNext[0][0]._4_4_ != -1 && (int)MasksNext[0][0] != -1) {
        if ((int)MasksNext[0][0] != MasksNext[0][0]._4_4_) {
          iVar6 = Abc_Lit2Var((int)MasksNext[0][0]);
          iVar8 = Abc_Lit2Var(iVar8);
          if (iVar6 != iVar8) {
            __assert_fail("Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3aa,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          iVar6 = p->pPars->nVarMax;
          bVar5 = (char)iVar6 - 6U & 0x1f;
          uVar22 = 0;
          uVar20 = (ulong)(uint)(1 << bVar5);
          if (1 << bVar5 < 1) {
            uVar20 = uVar22;
          }
          iVar8 = Abc_LitIsCompl(iVar10);
          wVar15 = 0x5555555555555555;
          if (iVar8 == 0) {
            wVar15 = 0xaaaaaaaaaaaaaaaa;
          }
          if (iVar6 < 7) {
            uVar20 = 1;
          }
          for (; uVar20 != uVar22; uVar22 = uVar22 + 1) {
            pTruth[uVar22] = wVar15;
          }
          iVar6 = Abc_Lit2Var(iVar10);
          *pSupp = iVar6;
          if (p->pPars->fVeryVerbose != 0) {
            iVar6 = Abc_LitIsCompl(iVar10);
            pcVar24 = "!";
            if (iVar6 == 0) {
              pcVar24 = "";
            }
            printf("Found variable %s%d.\n",pcVar24,(ulong)(uint)*pSupp);
          }
          return 1;
        }
        Vec_IntPop(p_00);
        Vec_IntPop(p->vImpls + 1);
      }
    }
    pSVar3 = p->pPars;
    if (pSVar3->nVarMax + -2 < nSuppAdd) {
      if (pSVar3->fVeryVerbose != 0) {
        puts("The number of assumption is more than MFFC size.");
        return -2;
      }
      return -2;
    }
    if (pSVar3->fUseAndOr != 0) {
      for (uVar20 = 0; uVar20 != 2; uVar20 = uVar20 + 1) {
        uVar22 = uVar20 & 0xffffffff ^ 1;
        if (1 < p->vImpls[uVar22].nSize) {
          p_01 = p_00 + uVar22;
          p->nSatCalls = p->nSatCalls + 1;
          iVar6 = Abc_Var2Lit(p->iTarget,(int)uVar20);
          *piVar1 = iVar6;
          iVar6 = p_01->nSize;
          if (0x3dd < iVar6) {
            __assert_fail("Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                          ,0x3c0,
                          "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                         );
          }
          end_00 = end;
          for (lVar23 = 0; lVar23 < iVar6; lVar23 = lVar23 + 1) {
            iVar6 = Vec_IntEntry(p_01,(int)lVar23);
            *end_00 = iVar6;
            iVar6 = p_01->nSize;
            end_00 = end_00 + 1;
          }
          aVar11 = Abc_Clock();
          iVar6 = sat_solver_solve(p->pSat,pAssump,end_00,lVar16,0,0,0);
          if (iVar6 == -1) {
            piVar4 = (p->pSat->conf_final).ptr;
            uVar7 = (p->pSat->conf_final).size;
            p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
            aVar12 = Abc_Clock();
            p->timeSatUnsat = p->timeSatUnsat + (aVar12 - aVar11);
            if ((int)(nSuppAdd + uVar7) < 7) {
              uVar18 = 0;
              uVar22 = (ulong)uVar7;
              if ((int)uVar7 < 1) {
                uVar22 = uVar18;
              }
              local_208 = 0;
              for (; uVar22 != uVar18; uVar18 = uVar18 + 1) {
                iVar6 = Abc_LitNot(piVar4[uVar18]);
                iVar6 = Vec_IntFind(p_01,iVar6);
                if (-1 < iVar6) {
                  iVar6 = Abc_LitNot(piVar4[uVar18]);
                  lVar16 = (long)(int)local_208;
                  local_208 = (ulong)((int)local_208 + 1);
                  pSupp[lVar16] = iVar6;
                }
              }
              if (6 < (int)local_208) {
                __assert_fail("nFinal <= 6",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x3d7,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
              uVar22 = 0;
              if (0 < (int)local_208) {
                uVar22 = local_208;
              }
              if (uVar20 == 0) {
                *pTruth = 0;
                for (lVar16 = 0; uVar22 * 8 != lVar16; lVar16 = lVar16 + 8) {
                  iVar6 = Abc_LitIsCompl(*pSupp);
                  *pTruth = *pTruth | (long)(iVar6 + -1) ^ *(ulong *)((long)s_Truths6 + lVar16);
                  iVar6 = Abc_Lit2Var(*pSupp);
                  *pSupp = iVar6;
                  pSupp = pSupp + 1;
                }
              }
              else {
                *pTruth = 0xffffffffffffffff;
                for (lVar16 = 0; uVar22 * 8 != lVar16; lVar16 = lVar16 + 8) {
                  iVar6 = Abc_LitIsCompl(*pSupp);
                  *pTruth = *pTruth & ((long)-iVar6 ^ *(ulong *)((long)s_Truths6 + lVar16));
                  iVar6 = Abc_Lit2Var(*pSupp);
                  *pSupp = iVar6;
                  pSupp = pSupp + 1;
                }
              }
              Abc_TtStretch6(pTruth,(int)local_208,p->pPars->nVarMax);
              p->nNodesAndOr = p->nNodesAndOr + 1;
              if (p->pPars->fVeryVerbose == 0) {
                return (int)local_208;
              }
              pcVar24 = "Found %d-input AND/OR gate.\n";
              uVar20 = local_208;
LAB_00402b42:
              printf(pcVar24,uVar20 & 0xffffffff);
              return (int)local_208;
            }
          }
          else {
            if (iVar6 != 1) {
              if (iVar6 != 0) {
                __assert_fail("status == l_True",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmDec.c"
                              ,0x3f0,
                              "int Sfm_DecPeformDec_rec(Sfm_Dec_t *, word *, int *, int *, int, word (*)[8], int, int)"
                             );
              }
LAB_00402e49:
              p->nTimeOuts = p->nTimeOuts + 1;
              return -2;
            }
            p->nSatCallsSat = p->nSatCallsSat + 1;
            aVar12 = Abc_Clock();
            p->timeSatSat = p->timeSatSat + (aVar12 - aVar11);
            if (p->nPats[uVar20] == 0x200) {
              p->nSatCallsOver = p->nSatCallsOver + 1;
            }
            else {
              for (iVar6 = 0; iVar6 < p->nDivs; iVar6 = iVar6 + 1) {
                iVar10 = sat_solver_var_value(p->pSat,iVar6);
                if (iVar10 != 0) {
                  pwVar14 = Sfm_DecDivPats(p,iVar6,(int)uVar20);
                  pwVar14[p->nPats[uVar20] >> 6] =
                       pwVar14[p->nPats[uVar20] >> 6] | 1L << ((byte)p->nPats[uVar20] & 0x3f);
                }
              }
              iVar6 = p->nPats[uVar20];
              p->nPatWords[uVar20] = (iVar6 >> 6) + 1;
              p->nPats[uVar20] = iVar6 + 1;
              Masks[uVar20][iVar6 >> 6] = Masks[uVar20][iVar6 >> 6] | 1L << ((byte)iVar6 & 0x3f);
            }
          }
        }
      }
    }
    uVar7 = Sfm_DecFindBestVar(p,Masks);
    if (fCofactor != 0 && uVar7 == 0xffffffff) {
      uVar7 = 0xffffffff;
      iVar6 = (p->vObjInMffc).nSize;
      do {
        iVar10 = iVar6;
        if (iVar10 < 1) break;
        uVar7 = Vec_IntEntry(&p->vObjInMffc,iVar10 + -1);
        iVar8 = Vec_IntFind(&p->vObjDec,uVar7);
        iVar6 = iVar10 + -1;
      } while (iVar8 != -1);
      fCofactor = 0;
      uVar7 = -(uint)(iVar10 == 0) | uVar7;
    }
    if (p->pPars->fVeryVerbose != 0) {
      Sfm_DecPrint(p,Masks);
      printf("Best var %d\n",(ulong)uVar7);
      putchar(10);
    }
  }
  else {
    p->iUseThis = -1;
  }
  if (-1 < (int)uVar7) {
    nSupp[0] = 0;
    nSupp[1] = 0;
    Vec_IntPush(&p->vObjDec,uVar7);
    lVar16 = 0;
    do {
      pawVar19 = MasksNext;
      if (lVar16 == 2) {
        iVar6 = Sfm_DecCombineDec(p,uTruth[0],uTruth[1],Supp[0],Supp[1],nSupp[0],nSupp[1],pTruth,
                                  pSupp,uVar7);
        return iVar6;
      }
      pawVar21 = Masks;
      for (lVar23 = 0; lVar23 != 2; lVar23 = lVar23 + 1) {
        pwVar14 = Sfm_DecDivPats(p,uVar7,(int)lVar23);
        uVar9 = p->nPatWords[lVar23];
        lVar17 = (long)(int)uVar9;
        uVar20 = 0;
        if (0 < (int)uVar9) {
          uVar20 = (ulong)uVar9;
        }
        uVar22 = 0;
        if (lVar16 == 1) {
          for (; uVar20 != uVar22; uVar22 = uVar22 + 1) {
            (*pawVar19)[uVar22] = pwVar14[uVar22] & (*pawVar21)[uVar22];
          }
        }
        else {
          for (; uVar20 != uVar22; uVar22 = uVar22 + 1) {
            (*pawVar19)[uVar22] = ~pwVar14[uVar22] & (*pawVar21)[uVar22];
          }
        }
        for (; lVar17 < 8; lVar17 = lVar17 + 1) {
          (*pawVar19)[lVar17] = 0;
        }
        pawVar19 = pawVar19 + 1;
        pawVar21 = pawVar21 + 1;
      }
      iVar6 = Abc_Var2Lit(uVar7,(uint)lVar16 ^ 1);
      pAssump[nAssump] = iVar6;
      memcpy(p->pDivWords[nAssump + 1],p->pDivWords[nAssump],(long)p->nDivWords << 3);
      iVar6 = 0;
      if (lVar16 != 0) {
        iVar6 = nSupp[0];
      }
      iVar6 = Sfm_DecPeformDec_rec
                        (p,uTruth[lVar16],Supp[lVar16],pAssump,nAssump + 1,MasksNext,fCofactor,
                         iVar6 + nSuppAdd + 1);
      nSupp[lVar16] = iVar6;
      lVar16 = lVar16 + 1;
    } while (iVar6 != -2);
  }
  return -2;
}

Assistant:

int Sfm_DecPeformDec_rec( Sfm_Dec_t * p, word * pTruth, int * pSupp, int * pAssump, int nAssump, word Masks[2][SFM_SIM_WORDS], int fCofactor, int nSuppAdd )
{
    int nBTLimit = p->pPars->nBTLimit;
//    int fVerbose = p->pPars->fVeryVerbose;
    int c, i, d, iLit, status, Var = -1;
    word * pDivWords = p->pDivWords[nAssump];
    abctime clk;
    assert( nAssump <= SFM_SUPP_MAX );
    if ( p->pPars->fVeryVerbose )
    {
        printf( "\nObject %d\n", p->iTarget );
        printf( "Divs = %d.  Nodes = %d.  Mffc = %d.  Mffc area = %.2f.    ", p->nDivs, Vec_IntSize(&p->vObjGates), p->nMffc, MIO_NUMINV*p->AreaMffc );
        printf( "Pat0 = %d.  Pat1 = %d.    ", p->nPats[0], p->nPats[1] );
        printf( "\n" );
        if ( nAssump )
        {
            printf( "Cofactor: " );
            for ( i = 0; i < nAssump; i++ )
                printf( " %s%d", Abc_LitIsCompl(pAssump[i])? "!":"", Abc_Lit2Var(pAssump[i]) );
            printf( "\n" );
        }
    }
    // check constant
    for ( c = 0; c < 2; c++ )
    {
        if ( !Abc_TtIsConst0(Masks[c], p->nPatWords[c]) ) // there are some patterns
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            Abc_TtConst( pTruth, Abc_TtWordNum(p->pPars->nVarMax), c );
            if ( p->pPars->fVeryVerbose )
                printf( "Found constant %d.\n", c );
            return 0;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    if ( p->iUseThis != -1 )
    {
        Var = p->iUseThis;
        p->iUseThis = -1;
        goto cofactor;
    }

    // check implications
    Vec_IntClear( &p->vImpls[0] );
    Vec_IntClear( &p->vImpls[1] );
    for ( d = 0; d < p->nDivs; d++ )
    {
        int Impls[2] = {-1, -1};
        for ( c = 0; c < 2; c++ )
        {
            word * pPats = Sfm_DecDivPats( p, d, c );
            int fHas0s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 1 );
            int fHas1s = Abc_TtIntersect( pPats, Masks[c], p->nPatWords[c], 0 );
            if ( fHas0s && fHas1s )
                continue;
            pAssump[nAssump]   = Abc_Var2Lit( p->iTarget, c );
            pAssump[nAssump+1] = Abc_Var2Lit( d, fHas1s ); // if there are 1s, check if 0 is SAT
            clk = Abc_Clock();
            if ( Abc_TtGetBit( pDivWords, 4*d+2*c+fHas1s ) )
            {
                p->nSatCallsUnsat--;
                status = l_False;
            }
            else
            {
                p->nSatCalls++;
                status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump + 2, nBTLimit, 0, 0, 0 );
            }
            if ( status == l_Undef )
            {
                p->nTimeOuts++;
                return -2;
            }
            if ( status == l_False )
            {
                p->nSatCallsUnsat++;
                p->timeSatUnsat += Abc_Clock() - clk;
                Impls[c] = Abc_LitNot(pAssump[nAssump+1]);
                Vec_IntPush( &p->vImpls[c], Abc_LitNot(pAssump[nAssump+1]) );
                Abc_TtSetBit( pDivWords, 4*d+2*c+fHas1s );
                continue;
            }
            assert( status == l_True );
            p->nSatCallsSat++;
            p->timeSatSat += Abc_Clock() - clk;
            if ( p->nPats[c] == 64*SFM_SIM_WORDS )
            {
                p->nSatCallsOver++;
                continue;//return -2;//continue;
            }
            // record this status
            for ( i = 0; i < p->nDivs; i++ )
                if ( sat_solver_var_value(p->pSat, i) )
                    Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
            p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
            Abc_TtSetBit( Masks[c], p->nPats[c]++ );
        }
        if ( Impls[0] == -1 || Impls[1] == -1 )
            continue;
        if ( Impls[0] == Impls[1] )
        {
            Vec_IntPop( &p->vImpls[0] );
            Vec_IntPop( &p->vImpls[1] );
            continue;
        }
        assert( Abc_Lit2Var(Impls[0]) == Abc_Lit2Var(Impls[1]) );
        // found buffer/inverter
        Abc_TtUnit( pTruth, Abc_TtWordNum(p->pPars->nVarMax), Abc_LitIsCompl(Impls[0]) );
        pSupp[0] = Abc_Lit2Var(Impls[0]);
        if ( p->pPars->fVeryVerbose )
            printf( "Found variable %s%d.\n", Abc_LitIsCompl(Impls[0]) ? "!":"", pSupp[0] );
        return 1;        
    }
    if ( nSuppAdd > p->pPars->nVarMax - 2 )
    {
        if ( p->pPars->fVeryVerbose )
            printf( "The number of assumption is more than MFFC size.\n" );
        return -2;
    }
    // try using all implications at once
    if ( p->pPars->fUseAndOr )
    for ( c = 0; c < 2; c++ )
    {
        if ( Vec_IntSize(&p->vImpls[!c]) < 2 )
            continue;
        p->nSatCalls++;
        pAssump[nAssump] = Abc_Var2Lit( p->iTarget, c );
        assert( Vec_IntSize(&p->vImpls[!c]) < SFM_WIN_MAX-10 );
        Vec_IntForEachEntry( &p->vImpls[!c], iLit, i )
            pAssump[nAssump+1+i] = iLit;
        clk = Abc_Clock();
        status = sat_solver_solve( p->pSat, pAssump, pAssump + nAssump+1+i, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
        {
            p->nTimeOuts++;
            return -2;
        }
        if ( status == l_False )
        {
            int * pFinal, nFinal = sat_solver_final( p->pSat, &pFinal );
            p->nSatCallsUnsat++;
            p->timeSatUnsat += Abc_Clock() - clk;
            if ( nFinal + nSuppAdd > 6 )
                continue;
            // collect only relevant literals
            for ( i = d = 0; i < nFinal; i++ )
                if ( Vec_IntFind(&p->vImpls[!c], Abc_LitNot(pFinal[i])) >= 0 )
                    pSupp[d++] = Abc_LitNot(pFinal[i]);
            nFinal = d;
            // create AND/OR gate
            assert( nFinal <= 6 );
            if ( c )
            {
                *pTruth = ~(word)0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth &= Abc_LitIsCompl(pSupp[i]) ? ~s_Truths6[i] : s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            else
            {
                *pTruth = 0;
                for ( i = 0; i < nFinal; i++ )
                {
                    *pTruth |= Abc_LitIsCompl(pSupp[i]) ? s_Truths6[i] : ~s_Truths6[i];
                    pSupp[i] = Abc_Lit2Var(pSupp[i]);
                }
            }
            Abc_TtStretch6( pTruth, nFinal, p->pPars->nVarMax );
            p->nNodesAndOr++;
            if ( p->pPars->fVeryVerbose )
                printf( "Found %d-input AND/OR gate.\n", nFinal );
            return nFinal;
        }
        assert( status == l_True );
        p->nSatCallsSat++;
        p->timeSatSat += Abc_Clock() - clk;
        if ( p->nPats[c] == 64*SFM_SIM_WORDS )
        {
            p->nSatCallsOver++;
            continue;//return -2;//continue;
        }
        for ( i = 0; i < p->nDivs; i++ )
            if ( sat_solver_var_value(p->pSat, i) )
                Abc_TtSetBit( Sfm_DecDivPats(p, i, c), p->nPats[c] );
        p->nPatWords[c] = 1 + (p->nPats[c] >> 6);
        Abc_TtSetBit( Masks[c], p->nPats[c]++ );
    }

    // find the best cofactoring variable
//    if ( !fCofactor || Vec_IntSize(&p->vImpls[0]) + Vec_IntSize(&p->vImpls[1]) > 2 )
    Var = Sfm_DecFindBestVar( p, Masks );
//    if ( Var == -1 )
//        Var = Sfm_DecFindBestVar2( p, Masks );

/*
    {
        int Lit0 = Vec_IntSize(&p->vImpls[0]) ? Vec_IntEntry(&p->vImpls[0], 0) : -1;
        int Lit1 = Vec_IntSize(&p->vImpls[1]) ? Vec_IntEntry(&p->vImpls[1], 0) : -1;
        if ( Lit0 == -1 && Lit1 >= 0 )
            Var = Abc_Lit2Var(Lit1);
        else if ( Lit1 == -1 && Lit0 >= 0 )
            Var = Abc_Lit2Var(Lit0);
        else if ( Lit0 >= 0 && Lit1 >= 0 )
        {
            if ( Lit0 < Lit1 )
                Var = Abc_Lit2Var(Lit0);
            else
                Var = Abc_Lit2Var(Lit1);
        }
    }
*/

    if ( Var == -1 && fCofactor )
    {
        //for ( Var = p->nDivs - 1; Var >= 0; Var-- )
        Vec_IntForEachEntryReverse( &p->vObjInMffc, Var, i )
            if ( Vec_IntFind(&p->vObjDec, Var) == -1 )
                break;
//        if ( i == Vec_IntSize(&p->vObjInMffc) )
        if ( i == -1 )
            Var = -1;
        fCofactor = 0;
    }

    if ( p->pPars->fVeryVerbose )
    {
        Sfm_DecPrint( p, Masks );
        printf( "Best var %d\n", Var );
        printf( "\n" );
    }
cofactor:
    // cofactor the problem
    if ( Var >= 0 )
    {
        word uTruth[2][SFM_WORD_MAX], MasksNext[2][SFM_SIM_WORDS];
        int w, Supp[2][2*SFM_SUPP_MAX], nSupp[2] = {0};
        Vec_IntPush( &p->vObjDec, Var );
        for ( i = 0; i < 2; i++ )
        {
            for ( c = 0; c < 2; c++ )
            {
                Abc_TtAndSharp( MasksNext[c], Masks[c], Sfm_DecDivPats(p, Var, c), p->nPatWords[c], !i );
                for ( w = p->nPatWords[c]; w < SFM_SIM_WORDS; w++ )
                    MasksNext[c][w] = 0;
            }
            pAssump[nAssump] = Abc_Var2Lit( Var, !i );
            memcpy( p->pDivWords[nAssump+1], p->pDivWords[nAssump], sizeof(word) * p->nDivWords );
            nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], Supp[i], pAssump, nAssump+1, MasksNext, fCofactor, (i ? nSupp[0] : 0) + nSuppAdd + 1 );
            if ( nSupp[i] == -2 )
                return -2;
        }
        // combine solutions
        return Sfm_DecCombineDec( p, uTruth[0], uTruth[1], Supp[0], Supp[1], nSupp[0], nSupp[1], pTruth, pSupp, Var );
    }
    return -2;
}